

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O1

void helper_roundpd_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,uint32_t mode)

{
  char cVar1;
  float64 fVar2;
  
  cVar1 = (env->sse_status).float_rounding_mode;
  if ((mode & 4) == 0) {
    (env->sse_status).float_rounding_mode = (byte)mode & 3;
  }
  fVar2 = float64_round_to_int_x86_64(s->_d_ZMMReg[0],&env->sse_status);
  d->_d_ZMMReg[0] = fVar2;
  fVar2 = float64_round_to_int_x86_64(s->_d_ZMMReg[1],&env->sse_status);
  d->_d_ZMMReg[1] = fVar2;
  (env->sse_status).float_rounding_mode = cVar1;
  return;
}

Assistant:

void glue(helper_roundpd, SUFFIX)(CPUX86State *env, Reg *d, Reg *s,
                                  uint32_t mode)
{
    signed char prev_rounding_mode;

    prev_rounding_mode = env->sse_status.float_rounding_mode;
    if (!(mode & (1 << 2))) {
        switch (mode & 3) {
        case 0:
            set_float_rounding_mode(float_round_nearest_even, &env->sse_status);
            break;
        case 1:
            set_float_rounding_mode(float_round_down, &env->sse_status);
            break;
        case 2:
            set_float_rounding_mode(float_round_up, &env->sse_status);
            break;
        case 3:
            set_float_rounding_mode(float_round_to_zero, &env->sse_status);
            break;
        }
    }

    d->ZMM_D(0) = float64_round_to_int(s->ZMM_D(0), &env->sse_status);
    d->ZMM_D(1) = float64_round_to_int(s->ZMM_D(1), &env->sse_status);

#if 0 /* TODO */
    if (mode & (1 << 3)) {
        set_float_exception_flags(get_float_exception_flags(&env->sse_status) &
                                  ~float_flag_inexact,
                                  &env->sse_status);
    }
#endif
    env->sse_status.float_rounding_mode = prev_rounding_mode;
}